

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

void dump_monsters(ang_file *fff)

{
  angband_constants *paVar1;
  monster_race *pmVar2;
  ulong uVar3;
  long lVar4;
  
  if (z_info->r_max != 0) {
    lVar4 = 4;
    uVar3 = 0;
    paVar1 = z_info;
    pmVar2 = r_info;
    do {
      if (*(long *)(pmVar2->flags + lVar4 * 4 + -0x5c) != 0) {
        file_putf(fff,"monster:%s:0x%02X:0x%02X\n",*(long *)(pmVar2->flags + lVar4 * 4 + -0x5c),
                  (ulong)monster_x_attr[uVar3],(ulong)(uint)monster_x_char[uVar3]);
        paVar1 = z_info;
        pmVar2 = r_info;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x34;
    } while (uVar3 < paVar1->r_max);
  }
  return;
}

Assistant:

void dump_monsters(ang_file *fff)
{
	int i;

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		uint8_t attr = monster_x_attr[i];
		wint_t chr = monster_x_char[i];

		/* Skip non-entries */
		if (!race->name) continue;

		file_putf(fff, "monster:%s:0x%02X:0x%02X\n", race->name, attr, chr);
	}
}